

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  ThreadSafeArena *pTVar1;
  Message *this_00;
  ThreadSafeArena *pTVar2;
  ThreadSafeArena *pTVar3;
  
  if (sub_message == (Message *)0x0) {
    sub_message = (Message *)0x0;
  }
  else {
    pTVar1 = (ThreadSafeArena *)(sub_message->super_MessageLite)._internal_metadata_.ptr_;
    pTVar3 = pTVar1;
    if (((ulong)pTVar1 & 1) != 0) {
      pTVar3 = *(ThreadSafeArena **)((ulong)pTVar1 & 0xfffffffffffffffe);
    }
    if (pTVar3 != (ThreadSafeArena *)0x0) {
      pTVar2 = (ThreadSafeArena *)(message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pTVar2 & 1) != 0) {
        pTVar2 = *(ThreadSafeArena **)((ulong)pTVar2 & 0xfffffffffffffffe);
      }
      if (pTVar3 != pTVar2) {
        SetAllocatedMessage();
        goto LAB_0041bce2;
      }
    }
    pTVar3 = (ThreadSafeArena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pTVar3 & 1) != 0) {
      pTVar3 = *(ThreadSafeArena **)((ulong)pTVar3 & 0xfffffffffffffffe);
    }
    if (((ulong)pTVar1 & 1) != 0) {
      pTVar1 = *(ThreadSafeArena **)((ulong)pTVar1 & 0xfffffffffffffffe);
    }
    if (pTVar3 != pTVar1) {
      if (pTVar1 != (ThreadSafeArena *)0x0) {
        this_00 = MutableMessage(this,message,field,(MessageFactory *)0x0);
        Message::CopyFrom(this_00,sub_message);
        return;
      }
      if (pTVar3 == (ThreadSafeArena *)0x0) {
LAB_0041bce2:
        SetAllocatedMessage();
      }
      internal::ThreadSafeArena::AddCleanup
                (pTVar3,sub_message,internal::arena_delete_object<google::protobuf::MessageLite>);
    }
  }
  UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  ABSL_DCHECK(sub_message == nullptr || sub_message->GetArena() == nullptr ||
              sub_message->GetArena() == message->GetArena());

  if (sub_message == nullptr) {
    UnsafeArenaSetAllocatedMessage(message, nullptr, field);
    return;
  }

  Arena* arena = message->GetArena();
  Arena* sub_arena = sub_message->GetArena();
  if (arena == sub_arena) {
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    return;
  }

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_arena == nullptr) {
    ABSL_DCHECK_NE(arena, nullptr);
    // Case 1: parent is on an arena and child is heap-allocated. We can add
    // the child to the arena's Own() list to free on arena destruction, then
    // set our pointer.
    arena->Own(sub_message);
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  } else {
    // Case 2: all other cases. We need to make a copy. MutableMessage() will
    // either get the existing message object, or instantiate a new one as
    // appropriate w.r.t. our arena.
    Message* sub_message_copy = MutableMessage(message, field);
    sub_message_copy->CopyFrom(*sub_message);
  }
}